

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O1

void __thiscall VariableAndMod::~VariableAndMod(VariableAndMod *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->modifiers)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->modifiers).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->variable_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->variable_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

VariableAndMod(string name, string mods)
      : variable_name(name), modifiers(mods) { }